

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_short,_5,_10,_15,_3U>
tcu::Float<unsigned_short,_5,_10,_15,_3U>::construct
          (int sign,int exponent,StorageType_conflict mantissa)

{
  short local_20;
  bool local_1d;
  StorageType_conflict exp;
  StorageType_conflict s;
  bool isDenormOrZero;
  bool isShorthandZero;
  StorageType_conflict mantissa_local;
  int exponent_local;
  int sign_local;
  
  local_1d = exponent == 0 && mantissa == 0;
  if ((local_1d) || (exponent == -0xe && (int)(uint)mantissa >> 10 == 0)) {
    local_20 = 0;
  }
  else {
    local_20 = (short)exponent + 0xf;
  }
  Float((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&exponent_local + 2),
        (ushort)(sign < 0) << 0xf | local_20 << 10 | mantissa & 0x3ff);
  return (Float<unsigned_short,_5,_10,_15,_3U>)exponent_local._2_2_;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::construct
	(int sign, int exponent, StorageType mantissa)
{
	// Repurpose this otherwise invalid input as a shorthand notation for zero (no need for caller to care about internal representation)
	const bool			isShorthandZero	= exponent == 0 && mantissa == 0;

	// Handles the typical notation for zero (min exponent, mantissa 0). Note that the exponent usually used exponent (-ExponentBias) for zero/subnormals is not used.
	// Instead zero/subnormals have the (normally implicit) leading mantissa bit set to zero.
	const bool			isDenormOrZero	= (exponent == 1 - ExponentBias) && (mantissa >> MantissaBits == 0);
	const StorageType	s				= StorageType((StorageType(sign < 0 ? 1 : 0)) << (StorageType(ExponentBits+MantissaBits)));
	const StorageType	exp				= (isShorthandZero  || isDenormOrZero) ? StorageType(0) : StorageType(exponent + ExponentBias);

	DE_ASSERT(sign == +1 || sign == -1);
	DE_ASSERT(isShorthandZero || isDenormOrZero || mantissa >> MantissaBits == 1);
	DE_ASSERT(exp >> ExponentBits == 0);

	return Float(StorageType(s | (exp << MantissaBits) | (mantissa & ((StorageType(1)<<MantissaBits)-1))));
}